

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseNoFrames(TidyDocImpl *doc,Node *noframes,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  TidyParserMemory data_00;
  Bool BVar2;
  Node *pNVar3;
  code *pcStack_d8;
  TidyParserMemory memory_2;
  Node *body;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  parserState state;
  Bool body_seen;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *noframes_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  _state = (Node *)0x0;
  memory._44_4_ = 0;
  memory.register_2 = 0;
  if (noframes == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    _state = memory.original_node;
    pNStack_20 = (Node *)memory.identity;
    memory.register_2 = memory.reentry_node._4_4_;
    memory._44_4_ = memory.reentry_state;
  }
  else {
    pNStack_20 = noframes;
    if ((doc->config).value[1].v == 0) {
      doc->badAccess = doc->badAccess | 0x20;
    }
  }
  while( true ) {
    while( true ) {
      do {
        while( true ) {
          while( true ) {
            while( true ) {
              if (memory.register_2 == 2) {
                prvTidyReport(doc,pNStack_20,_state,0x25a);
                return (Node *)0x0;
              }
              if (memory.register_2 == 0) break;
              if (memory.register_2 == 1) {
                if ((memory._44_4_ != 0) && (pNVar3 = prvTidyFindBody(doc), pNVar3 != _state)) {
                  prvTidyCoerceNode(doc,_state,TidyTag_DIV,no,no);
                  MoveNodeToBody(doc,_state);
                }
                memory.register_2 = 0;
              }
            }
            _state = prvTidyGetToken(doc,IgnoreWhitespace);
            if (_state != (Node *)0x0) break;
            memory.register_2 = 2;
          }
          if ((_state->tag == pNStack_20->tag) && (_state->type == EndTag)) {
            prvTidyFreeNode(doc,_state);
            pNStack_20->closed = yes;
            TrimSpaces(doc,pNStack_20);
            return (Node *)0x0;
          }
          if ((((_state != (Node *)0x0) && (_state->tag != (Dict *)0x0)) &&
              (_state->tag->id == TidyTag_FRAME)) ||
             (((_state != (Node *)0x0 && (_state->tag != (Dict *)0x0)) &&
              (_state->tag->id == TidyTag_FRAMESET)))) {
            TrimSpaces(doc,pNStack_20);
            if (_state->type == EndTag) {
              prvTidyReport(doc,pNStack_20,_state,0x235);
              prvTidyFreeNode(doc,_state);
            }
            else {
              prvTidyReport(doc,pNStack_20,_state,0x259);
              prvTidyUngetToken(doc);
            }
            return (Node *)0x0;
          }
          if (((_state == (Node *)0x0) || (_state->tag == (Dict *)0x0)) ||
             (_state->tag->id != TidyTag_HTML)) break;
          BVar2 = prvTidynodeIsElement(_state);
          if (BVar2 != no) {
            prvTidyReport(doc,pNStack_20,_state,0x235);
          }
          prvTidyFreeNode(doc,_state);
        }
        BVar2 = InsertMisc(pNStack_20,_state);
      } while (BVar2 != no);
      if ((((_state != (Node *)0x0) && (_state->tag != (Dict *)0x0)) &&
          (_state->tag->id == TidyTag_BODY)) && (_state->type == StartTag)) {
        memset(&body,0,0x30);
        body = (Node *)prvTidyParseNoFrames;
        memory_1.identity = (Parser *)pNStack_20;
        memory_1.reentry_node._4_4_ = 1;
        memory_1.reentry_state = pLVar1->seenEndBody;
        memory_1.reentry_mode = IgnoreWhitespace;
        memory_1.original_node = _state;
        prvTidyInsertNodeAtEnd(pNStack_20,_state);
        data.reentry_state = memory_1.reentry_node._4_4_;
        data.reentry_mode = memory_1.reentry_node._0_4_;
        data.register_1 = memory_1.reentry_state;
        data.mode = memory_1.reentry_mode;
        data.original_node = (Node *)memory_1.identity;
        data.identity = (Parser *)body;
        data.reentry_node = memory_1.original_node;
        data.register_2 = memory_1.mode;
        data._44_4_ = memory_1.register_1;
        prvTidypushMemory(doc,data);
        return _state;
      }
      BVar2 = prvTidynodeIsText(_state);
      if ((BVar2 != no) || ((_state->tag != (Dict *)0x0 && (_state->type != EndTag)))) break;
      prvTidyReport(doc,pNStack_20,_state,0x235);
      prvTidyFreeNode(doc,_state);
    }
    memory_2._40_8_ = prvTidyFindBody(doc);
    if (((Node *)memory_2._40_8_ == (Node *)0x0) && (pLVar1->seenEndBody == no)) break;
    if ((Node *)memory_2._40_8_ != (Node *)0x0) {
      BVar2 = prvTidynodeIsText(_state);
      if (BVar2 != no) {
        prvTidyUngetToken(doc);
        _state = prvTidyInferredTag(doc,TidyTag_P);
        prvTidyReport(doc,pNStack_20,_state,0x233);
      }
      prvTidyInsertNodeAtEnd((Node *)memory_2._40_8_,_state);
      goto LAB_001446dc;
    }
    prvTidyReport(doc,pNStack_20,_state,0x235);
    prvTidyFreeNode(doc,_state);
  }
  prvTidyUngetToken(doc);
  _state = prvTidyInferredTag(doc,TidyTag_BODY);
  if ((int)(doc->config).value[100].v != 0) {
    prvTidyReport(doc,pNStack_20,_state,0x247);
  }
  prvTidyInsertNodeAtEnd(pNStack_20,_state);
LAB_001446dc:
  memset(&pcStack_d8,0,0x30);
  pcStack_d8 = prvTidyParseNoFrames;
  memory_2.identity = (Parser *)pNStack_20;
  memory_2.original_node = _state;
  memory_2.reentry_mode = IgnoreWhitespace;
  memory_2.reentry_node._4_4_ = 0;
  data_00.original_node = pNStack_20;
  data_00.identity = prvTidyParseNoFrames;
  data_00.reentry_node = _state;
  data_00.reentry_mode = memory_2.reentry_node._0_4_;
  data_00.reentry_state = 0;
  data_00.mode = (int)((ulong)(uint)memory_2.reentry_state << 0x20);
  data_00.register_1 = (int)(((ulong)(uint)memory_2.reentry_state << 0x20) >> 0x20);
  data_00.register_2 = memory_2.mode;
  data_00._44_4_ = memory_2.register_1;
  prvTidypushMemory(doc,data_00);
  return _state;
}

Assistant:

Node* TY_(ParseNoFrames)( TidyDocImpl* doc, Node *noframes, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool body_seen = no;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NODEISBODY,        /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( noframes == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, because we replace it entering the loop anyway.*/
        DEBUG_LOG_REENTER_WITH_NODE(node);
        noframes = memory.original_node;
        state = memory.reentry_state;
        body_seen = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(noframes);
        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            doc->badAccess |=  BA_USING_NOFRAMES;
        }
    }

    mode = IgnoreWhitespace;

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
        {
            node = TY_(GetToken)(doc, mode);
            DEBUG_LOG_GOT_TOKEN(node);
        }
        
        switch ( state )
        {
            case STATE_INITIAL:
            {
                if ( node == NULL )
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if ( node->tag == noframes->tag && node->type == EndTag )
                {
                    TY_(FreeNode)( doc, node);
                    noframes->closed = yes;
                    TrimSpaces(doc, noframes);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if ( nodeIsFRAME(node) || nodeIsFRAMESET(node) )
                {
                    TrimSpaces(doc, noframes);
                    if (node->type == EndTag)
                    {
                        TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);       /* Throw it away */
                    }
                    else
                    {
                        TY_(Report)(doc, noframes, node, MISSING_ENDTAG_BEFORE);
                        TY_(UngetToken)( doc );
                    }
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if ( nodeIsHTML(node) )
                {
                    if (TY_(nodeIsElement)(node))
                        TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);

                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* deal with comments etc. */
                if (InsertMisc(noframes, node))
                    continue;

                if ( nodeIsBODY(node) && node->type == StartTag )
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseNoFrames);
                    memory.original_node = noframes;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_POST_NODEISBODY;
                    memory.register_1 = lexer->seenEndBody;
                    memory.mode = IgnoreWhitespace;

                    TY_(InsertNodeAtEnd)(noframes, node);
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }

                /* implicit body element inferred */
                if (TY_(nodeIsText)(node) || (node->tag && node->type != EndTag))
                {
                    Node *body = TY_(FindBody)( doc );
                    if ( body || lexer->seenEndBody )
                    {
                        if ( body == NULL )
                        {
                            TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                            TY_(FreeNode)( doc, node);
                            continue;
                        }
                        if ( TY_(nodeIsText)(node) )
                        {
                            TY_(UngetToken)( doc );
                            node = TY_(InferredTag)(doc, TidyTag_P);
                            TY_(Report)(doc, noframes, node, CONTENT_AFTER_BODY );
                        }
                        TY_(InsertNodeAtEnd)( body, node );
                    }
                    else
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        if ( cfgBool(doc, TidyXmlOut) )
                            TY_(Report)(doc, noframes, node, INSERTING_TAG);
                        TY_(InsertNodeAtEnd)( noframes, node );
                    }

                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParseNoFrames);
                        memory.original_node = noframes;
                        memory.reentry_node = node;
                        memory.mode = IgnoreWhitespace; /*MixedContent*/
                        memory.reentry_state = STATE_INITIAL;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                /* discard unexpected end tags */
                TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            } break;
                
                
            case STATE_POST_NODEISBODY:
            {
                /* fix for bug http://tidy.sf.net/bug/887259 */
                if (body_seen && TY_(FindBody)(doc) != node)
                {
                    TY_(CoerceNode)(doc, node, TidyTag_DIV, no, no);
                    MoveNodeToBody(doc, node);
                }
                state = STATE_INITIAL;
                continue;

            } break;
                
                
            default:
                break;
        } /* switch */
    } /* while */

    TY_(Report)(doc, noframes, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}